

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.hpp
# Opt level: O2

bool __thiscall
vk::ValidateQueryBits::
validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceProperties>
          (ValidateQueryBits *this,VkPhysicalDevice_s *context,
          offset_in_InstanceInterface_to_subr Function,InstanceInterface *interface,
          QueryMemberTableEntry *queryMemberTableEntry)

{
  size_t __n;
  int iVar1;
  VkPhysicalDevice_s *pVVar2;
  size_t *psVar3;
  long *plVar4;
  VkPhysicalDeviceProperties vec [2];
  undefined1 auStack_6a8 [824];
  undefined1 local_370 [832];
  
  memset(auStack_6a8,0,0x338);
  memset(local_370,0xff,0x338);
  plVar4 = (long *)((long)&interface->_vptr_InstanceInterface + Function);
  pVVar2 = context;
  if (((ulong)context & 1) != 0) {
    pVVar2 = *(VkPhysicalDevice_s **)(context + *plVar4 + -1);
  }
  (*(code *)pVVar2)(plVar4,this,auStack_6a8);
  if (((ulong)context & 1) != 0) {
    context = *(VkPhysicalDevice_s **)(context + *plVar4 + -1);
  }
  (*(code *)context)(plVar4,this,local_370);
  psVar3 = &queryMemberTableEntry->size;
  do {
    __n = *psVar3;
    if (__n == 0) break;
    iVar1 = bcmp(auStack_6a8 + ((QueryMemberTableEntry *)(psVar3 + -1))->offset,
                 local_370 + ((QueryMemberTableEntry *)(psVar3 + -1))->offset,__n);
    psVar3 = psVar3 + 2;
  } while (iVar1 == 0);
  return __n == 0;
}

Assistant:

bool validateInitComplete(Context context, void (Interface::*Function)(Context, Type*)const, const Interface& interface, const QueryMemberTableEntry* queryMemberTableEntry)
{
	const QueryMemberTableEntry	*iterator;
	Type vec[2];
	deMemset(&vec[0], 0x00, sizeof(Type));
	deMemset(&vec[1], 0xFF, sizeof(Type));

	(interface.*Function)(context, &vec[0]);
	(interface.*Function)(context, &vec[1]);

	for (iterator = queryMemberTableEntry; iterator->size != 0; iterator++)
	{
		if (deMemCmp(((deUint8*)(&vec[0]))+iterator->offset, ((deUint8*)(&vec[1]))+iterator->offset, iterator->size) != 0)
			return false;
	}

	return true;
}